

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t FSE_readNCount(short *normalizedCounter,uint *maxSVPtr,uint *tableLogPtr,void *headerBuffer,
                     size_t hbSize)

{
  int iVar1;
  uint *puVar2;
  uint uVar3;
  size_t sVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint *puVar9;
  ulong uVar10;
  uint *puVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  uint *puVar19;
  bool bVar20;
  size_t sStack_60;
  char buffer [4];
  
  if (hbSize < 4) {
    buffer[0] = '\0';
    buffer[1] = '\0';
    buffer[2] = '\0';
    buffer[3] = '\0';
    memcpy(buffer,headerBuffer,hbSize);
    sVar4 = FSE_readNCount(normalizedCounter,maxSVPtr,tableLogPtr,buffer,4);
    sStack_60 = 0xffffffffffffffec;
    if (sVar4 <= hbSize) {
      sStack_60 = sVar4;
    }
    if (0xffffffffffffff88 < sVar4) {
      sStack_60 = sVar4;
    }
  }
  else {
    memset(normalizedCounter,0,(ulong)(*maxSVPtr + 1) * 2);
    uVar7 = *headerBuffer & 0xf;
    if (uVar7 < 0xb) {
      uVar17 = *headerBuffer >> 4;
      *tableLogPtr = uVar7 + 5;
      iVar12 = 0x20 << (sbyte)uVar7;
      iVar13 = iVar12 + 1;
      iVar8 = uVar7 + 6;
      uVar7 = *maxSVPtr;
      puVar2 = (uint *)((long)headerBuffer + (hbSize - 7));
      puVar19 = (uint *)((long)headerBuffer + (hbSize - 4));
      bVar20 = true;
      uVar3 = 4;
      uVar14 = 0;
      puVar9 = (uint *)headerBuffer;
      while ((1 < iVar13 && ((uint)uVar14 <= uVar7))) {
        puVar11 = puVar9;
        if (!bVar20) {
          uVar6 = uVar3 + 2;
          uVar10 = uVar14;
          uVar5 = uVar3;
          while (uVar3 = uVar6, (short)uVar17 == -1) {
            if (puVar9 < (uint *)((long)headerBuffer + (hbSize - 5))) {
              puVar11 = (uint *)((long)puVar9 + 2);
              puVar9 = (uint *)((long)puVar9 + 2);
              uVar17 = *puVar11 >> ((byte)uVar5 & 0x1f);
              uVar10 = (ulong)((int)uVar10 + 0x18);
            }
            else {
              uVar17 = uVar17 >> 0x10;
              uVar5 = uVar5 + 0x10;
              uVar10 = (ulong)((int)uVar10 + 0x18);
              uVar6 = uVar6 + 0x10;
            }
          }
          for (; (~uVar17 & 3) == 0; uVar17 = uVar17 >> 2) {
            uVar10 = (ulong)((int)uVar10 + 3);
            uVar3 = uVar3 + 2;
          }
          uVar5 = (uVar17 & 3) + (int)uVar10;
          if (uVar7 < uVar5) {
            return 0xffffffffffffffd0;
          }
          for (; uVar14 < uVar5; uVar14 = uVar14 + 1) {
            normalizedCounter[uVar14] = 0;
          }
          iVar15 = (int)uVar3 >> 3;
          puVar11 = (uint *)((long)puVar9 + (long)iVar15);
          if ((puVar2 < puVar9) && (puVar19 < puVar11)) {
            uVar17 = uVar17 >> 2;
            puVar11 = puVar9;
          }
          else {
            if (3 < iVar15) {
              __assert_fail("(bitCount >> 3) <= 3",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0xa16,
                            "size_t FSE_readNCount(short *, unsigned int *, unsigned int *, const void *, size_t)"
                           );
            }
            uVar3 = uVar3 & 7;
            uVar17 = *(uint *)((long)puVar9 + (long)iVar15) >> (sbyte)uVar3;
          }
        }
        uVar5 = iVar12 * 2 - 1;
        uVar6 = uVar5 - iVar13;
        uVar16 = iVar12 - 1U & uVar17;
        if (uVar16 < uVar6) {
          iVar15 = iVar8 + -1;
        }
        else {
          uVar17 = uVar17 & uVar5;
          if ((int)uVar17 < iVar12) {
            uVar6 = 0;
          }
          uVar16 = uVar17 - uVar6;
          iVar15 = iVar8;
        }
        iVar1 = uVar16 - 1;
        iVar18 = 1 - uVar16;
        if (0 < (int)uVar16) {
          iVar18 = iVar1;
        }
        iVar13 = iVar13 - iVar18;
        normalizedCounter[uVar14 & 0xffffffff] = (short)iVar1;
        for (; iVar13 < iVar12; iVar12 = iVar12 >> 1) {
          iVar8 = iVar8 + -1;
        }
        uVar17 = iVar15 + uVar3;
        uVar14 = (ulong)((int)uVar14 + 1);
        bVar20 = iVar1 != 0;
        puVar9 = (uint *)((long)((int)uVar17 >> 3) + (long)puVar11);
        uVar3 = uVar17 & 7;
        if (puVar2 < puVar11 && puVar19 < puVar9) {
          puVar9 = puVar19;
          uVar3 = uVar17 + ((int)puVar11 - (int)puVar19) * 8;
        }
        uVar17 = *puVar9 >> ((byte)uVar3 & 0x1f);
      }
      sStack_60 = 0xffffffffffffffec;
      if ((iVar13 == 1) && ((int)uVar3 < 0x21)) {
        *maxSVPtr = (uint)uVar14 - 1;
        sStack_60 = (long)puVar9 + ((long)((int)(uVar3 + 7) >> 3) - (long)headerBuffer);
      }
    }
    else {
      sStack_60 = 0xffffffffffffffd4;
    }
  }
  return sStack_60;
}

Assistant:

size_t FSE_readNCount (short* normalizedCounter, unsigned* maxSVPtr, unsigned* tableLogPtr,
                 const void* headerBuffer, size_t hbSize)
{
    const BYTE* const istart = (const BYTE*) headerBuffer;
    const BYTE* const iend = istart + hbSize;
    const BYTE* ip = istart;
    int nbBits;
    int remaining;
    int threshold;
    U32 bitStream;
    int bitCount;
    unsigned charnum = 0;
    int previous0 = 0;

    if (hbSize < 4) {
        /* This function only works when hbSize >= 4 */
        char buffer[4];
        memset(buffer, 0, sizeof(buffer));
        memcpy(buffer, headerBuffer, hbSize);
        {   size_t const countSize = FSE_readNCount(normalizedCounter, maxSVPtr, tableLogPtr,
                                                    buffer, sizeof(buffer));
            if (FSE_isError(countSize)) return countSize;
            if (countSize > hbSize) return ERROR(corruption_detected);
            return countSize;
    }   }
    assert(hbSize >= 4);

    /* init */
    memset(normalizedCounter, 0, (*maxSVPtr+1) * sizeof(normalizedCounter[0]));   /* all symbols not present in NCount have a frequency of 0 */
    bitStream = MEM_readLE32(ip);
    nbBits = (bitStream & 0xF) + FSE_MIN_TABLELOG;   /* extract tableLog */
    if (nbBits > FSE_TABLELOG_ABSOLUTE_MAX) return ERROR(tableLog_tooLarge);
    bitStream >>= 4;
    bitCount = 4;
    *tableLogPtr = nbBits;
    remaining = (1<<nbBits)+1;
    threshold = 1<<nbBits;
    nbBits++;

    while ((remaining>1) & (charnum<=*maxSVPtr)) {
        if (previous0) {
            unsigned n0 = charnum;
            while ((bitStream & 0xFFFF) == 0xFFFF) {
                n0 += 24;
                if (ip < iend-5) {
                    ip += 2;
                    bitStream = MEM_readLE32(ip) >> bitCount;
                } else {
                    bitStream >>= 16;
                    bitCount   += 16;
            }   }
            while ((bitStream & 3) == 3) {
                n0 += 3;
                bitStream >>= 2;
                bitCount += 2;
            }
            n0 += bitStream & 3;
            bitCount += 2;
            if (n0 > *maxSVPtr) return ERROR(maxSymbolValue_tooSmall);
            while (charnum < n0) normalizedCounter[charnum++] = 0;
            if ((ip <= iend-7) || (ip + (bitCount>>3) <= iend-4)) {
                assert((bitCount >> 3) <= 3); /* For first condition to work */
                ip += bitCount>>3;
                bitCount &= 7;
                bitStream = MEM_readLE32(ip) >> bitCount;
            } else {
                bitStream >>= 2;
        }   }
        {   int const max = (2*threshold-1) - remaining;
            int count;

            if ((bitStream & (threshold-1)) < (U32)max) {
                count = bitStream & (threshold-1);
                bitCount += nbBits-1;
            } else {
                count = bitStream & (2*threshold-1);
                if (count >= threshold) count -= max;
                bitCount += nbBits;
            }

            count--;   /* extra accuracy */
            remaining -= count < 0 ? -count : count;   /* -1 means +1 */
            normalizedCounter[charnum++] = (short)count;
            previous0 = !count;
            while (remaining < threshold) {
                nbBits--;
                threshold >>= 1;
            }

            if ((ip <= iend-7) || (ip + (bitCount>>3) <= iend-4)) {
                ip += bitCount>>3;
                bitCount &= 7;
            } else {
                bitCount -= (int)(8 * (iend - 4 - ip));
                ip = iend - 4;
            }
            bitStream = MEM_readLE32(ip) >> (bitCount & 31);
    }   }   /* while ((remaining>1) & (charnum<=*maxSVPtr)) */
    if (remaining != 1) return ERROR(corruption_detected);
    if (bitCount > 32) return ERROR(corruption_detected);
    *maxSVPtr = charnum-1;

    ip += (bitCount+7)>>3;
    return ip-istart;
}